

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void __thiscall ImGuiWindow::ImGuiWindow(ImGuiWindow *this,ImGuiContext *context,char *name)

{
  ImGuiID IVar1;
  char *pcVar2;
  size_t sVar3;
  ImRect *local_80;
  ImVec2 local_44;
  ImVec2 local_3c;
  ImVec2 local_34 [2];
  char *local_20;
  char *name_local;
  ImGuiContext *context_local;
  ImGuiWindow *this_local;
  
  local_20 = name;
  name_local = &context->Initialized;
  context_local = (ImGuiContext *)this;
  ImVec2::ImVec2(&this->Pos);
  ImVec2::ImVec2(&this->Size);
  ImVec2::ImVec2(&this->SizeFull);
  ImVec2::ImVec2(&this->ContentSize);
  ImVec2::ImVec2(&this->ContentSizeIdeal);
  ImVec2::ImVec2(&this->ContentSizeExplicit);
  ImVec2::ImVec2(&this->WindowPadding);
  ImVec2::ImVec2(&this->Scroll);
  ImVec2::ImVec2(&this->ScrollMax);
  ImVec2::ImVec2(&this->ScrollTarget);
  ImVec2::ImVec2(&this->ScrollTargetCenterRatio);
  ImVec2::ImVec2(&this->ScrollTargetEdgeSnapDist);
  ImVec2::ImVec2(&this->ScrollbarSizes);
  ImVec2::ImVec2(&this->SetWindowPosVal);
  ImVec2::ImVec2(&this->SetWindowPosPivot);
  ImVector<unsigned_int>::ImVector(&this->IDStack);
  ImGuiWindowTempData::ImGuiWindowTempData(&this->DC);
  ImRect::ImRect(&this->OuterRectClipped);
  ImRect::ImRect(&this->InnerRect);
  ImRect::ImRect(&this->InnerClipRect);
  ImRect::ImRect(&this->WorkRect);
  ImRect::ImRect(&this->ParentWorkRect);
  ImRect::ImRect(&this->ClipRect);
  ImRect::ImRect(&this->ContentRegionRect);
  ImVec2ih::ImVec2ih(&this->HitTestHoleSize);
  ImVec2ih::ImVec2ih(&this->HitTestHoleOffset);
  ImGuiStorage::ImGuiStorage(&this->StateStorage);
  ImVector<ImGuiOldColumns>::ImVector(&this->ColumnsStorage);
  ImDrawList::ImDrawList(&this->DrawListInst,(ImDrawListSharedData *)0x0);
  local_80 = this->NavRectRel;
  do {
    ImRect::ImRect(local_80);
    local_80 = local_80 + 1;
  } while (local_80 != (ImRect *)&this->MemoryDrawListIdxCapacity);
  memset(this,0,0x3e0);
  pcVar2 = ImStrdup(local_20);
  this->Name = pcVar2;
  sVar3 = strlen(local_20);
  this->NameBufLen = (int)sVar3 + 1;
  IVar1 = ImHashStr(local_20,0,0);
  this->ID = IVar1;
  ImVector<unsigned_int>::push_back(&this->IDStack,&this->ID);
  IVar1 = GetID(this,"#MOVE",(char *)0x0);
  this->MoveId = IVar1;
  ImVec2::ImVec2(local_34,3.4028235e+38,3.4028235e+38);
  this->ScrollTarget = local_34[0];
  ImVec2::ImVec2(&local_3c,0.5,0.5);
  this->ScrollTargetCenterRatio = local_3c;
  this->AutoFitFramesY = -1;
  this->AutoFitFramesX = -1;
  this->AutoPosLastDirection = -1;
  this->field_0xb6 = 0xf;
  this->field_0xb5 = 0xf;
  this->field_0xb4 = 0xf;
  ImVec2::ImVec2(&local_44,3.4028235e+38,3.4028235e+38);
  this->SetWindowPosPivot = local_44;
  this->SetWindowPosVal = this->SetWindowPosPivot;
  this->LastFrameActive = -1;
  this->LastTimeActive = -1.0;
  this->FontWindowScale = 1.0;
  this->SettingsOffset = -1;
  this->DrawList = &this->DrawListInst;
  this->DrawList->_Data = (ImDrawListSharedData *)(name_local + 0x1988);
  this->DrawList->_OwnerName = this->Name;
  return;
}

Assistant:

ImGuiWindow::ImGuiWindow(ImGuiContext* context, const char* name) : DrawListInst(NULL)
{
    memset(this, 0, sizeof(*this));
    Name = ImStrdup(name);
    NameBufLen = (int)strlen(name) + 1;
    ID = ImHashStr(name);
    IDStack.push_back(ID);
    MoveId = GetID("#MOVE");
    ScrollTarget = ImVec2(FLT_MAX, FLT_MAX);
    ScrollTargetCenterRatio = ImVec2(0.5f, 0.5f);
    AutoFitFramesX = AutoFitFramesY = -1;
    AutoPosLastDirection = ImGuiDir_None;
    SetWindowPosAllowFlags = SetWindowSizeAllowFlags = SetWindowCollapsedAllowFlags = ImGuiCond_Always | ImGuiCond_Once | ImGuiCond_FirstUseEver | ImGuiCond_Appearing;
    SetWindowPosVal = SetWindowPosPivot = ImVec2(FLT_MAX, FLT_MAX);
    LastFrameActive = -1;
    LastTimeActive = -1.0f;
    FontWindowScale = 1.0f;
    SettingsOffset = -1;
    DrawList = &DrawListInst;
    DrawList->_Data = &context->DrawListSharedData;
    DrawList->_OwnerName = Name;
}